

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O0

void __thiscall nesvis::PpuWidget::draw_palettes(PpuWidget *this)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  IPpu *pIVar4;
  const_reference this_00;
  char *pcVar5;
  ImGuiStyle *pIVar6;
  size_type __n;
  ImVec2 local_178;
  Color local_170;
  undefined1 local_16c [8];
  ImVec4 color_1;
  int n;
  Color local_150;
  undefined1 local_14c [8];
  ImVec4 color;
  uint8_t palette_index;
  uint16_t address;
  int text_index;
  allocator<char> local_119;
  string *local_118;
  undefined1 local_110 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  palette_text;
  PpuWidget *this_local;
  
  palette_text._M_elems[7].field_2._8_8_ = this;
  ImGui::Text("Background palette");
  ImGui::PushID("background palette");
  local_118 = (string *)local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"Background 0",&local_119);
  psVar3 = (string *)(palette_text._M_elems[0].field_2._M_local_buf + 8);
  local_118 = psVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar3,"Background 1",(allocator<char> *)((long)&text_index + 3));
  psVar3 = (string *)(palette_text._M_elems[1].field_2._M_local_buf + 8);
  local_118 = psVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar3,"Background 2",(allocator<char> *)((long)&text_index + 2));
  psVar3 = (string *)(palette_text._M_elems[2].field_2._M_local_buf + 8);
  local_118 = psVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar3,"Background 3",(allocator<char> *)((long)&text_index + 1));
  psVar3 = (string *)(palette_text._M_elems[3].field_2._M_local_buf + 8);
  local_118 = psVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar3,"Sprite 0",(allocator<char> *)&text_index);
  psVar3 = (string *)(palette_text._M_elems[4].field_2._M_local_buf + 8);
  local_118 = psVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar3,"Sprite 1",(allocator<char> *)((long)&address + 1));
  psVar3 = (string *)(palette_text._M_elems[5].field_2._M_local_buf + 8);
  local_118 = psVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar3,"Sprite 2",(allocator<char> *)&address);
  psVar3 = (string *)(palette_text._M_elems[6].field_2._M_local_buf + 8);
  local_118 = psVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar3,"Sprite 3",(allocator<char> *)&palette_index);
  std::allocator<char>::~allocator((allocator<char> *)&palette_index);
  std::allocator<char>::~allocator((allocator<char> *)&address);
  std::allocator<char>::~allocator((allocator<char> *)((long)&address + 1));
  std::allocator<char>::~allocator((allocator<char> *)&text_index);
  std::allocator<char>::~allocator((allocator<char> *)((long)&text_index + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&text_index + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&text_index + 3));
  std::allocator<char>::~allocator(&local_119);
  color.w = 0.0;
  for (color.z._2_2_ = 0x3f00; color.z._2_2_ < 0x3f20; color.z._2_2_ = color.z._2_2_ + 1) {
    pIVar4 = n_e_s::nes::Nes::ppu(this->nes_);
    uVar2 = (*pIVar4->_vptr_IPpu[2])(pIVar4,(ulong)color.z._2_2_);
    color.z._1_1_ = (byte)uVar2;
    ImGui::PushID(uVar2 & 0xff);
    if ((uint)color.z._2_2_ % 4 == 0) {
      __n = (size_type)(int)color.w;
      color.w = (float)((int)color.w + 1);
      this_00 = std::
                array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                              *)local_110,__n);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(this_00);
      ImGui::Text("%s",pcVar5);
      ImGui::SameLine(100.0,-1.0);
    }
    if ((uint)color.z._2_2_ % 4 != 0) {
      pIVar6 = ImGui::GetStyle();
      ImGui::SameLine(0.0,(pIVar6->ItemSpacing).y);
    }
    local_150 = PpuHelper::get_color_from_index(this->ppu_helper_,(ushort)color.z._1_1_);
    ImVec4::ImVec4((ImVec4 *)local_14c,&local_150);
    ImVec2::ImVec2((ImVec2 *)&color_1.w,20.0,20.0);
    ImGui::ColorButton("##backgroundpalette",(ImVec4 *)local_14c,0x44,stack0xfffffffffffffea8);
    bVar1 = ImGui::IsItemHovered(0);
    if (bVar1) {
      ImGui::BeginTooltip();
      ImGui::Text("Address: %04hX",(ulong)color.z._2_2_);
      ImGui::Text("index: %02hhX",(ulong)color.z._1_1_);
      ImGui::EndTooltip();
    }
    ImGui::PopID();
  }
  ImGui::PopID();
  ImGui::PushID("palette");
  for (color_1.z = 0.0; (int)color_1.z < 0x40; color_1.z = (float)((int)color_1.z + 1)) {
    ImGui::PushID((int)color_1.z);
    if ((int)color_1.z % 0x10 != 0) {
      pIVar6 = ImGui::GetStyle();
      ImGui::SameLine(0.0,(pIVar6->ItemSpacing).y);
    }
    local_170 = PpuHelper::get_color_from_index(this->ppu_helper_,color_1.z._0_2_);
    ImVec4::ImVec4((ImVec4 *)local_16c,&local_170);
    ImVec2::ImVec2(&local_178,20.0,20.0);
    ImGui::ColorButton("##palette",(ImVec4 *)local_16c,4,local_178);
    ImGui::PopID();
  }
  ImGui::PopID();
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *)local_110);
  return;
}

Assistant:

void PpuWidget::draw_palettes() {
    ImGui::Text("Background palette");
    ImGui::PushID("background palette");

    const std::array<std::string, 8> palette_text = {"Background 0",
            "Background 1",
            "Background 2",
            "Background 3",
            "Sprite 0",
            "Sprite 1",
            "Sprite 2",
            "Sprite 3"};
    int text_index = 0;

    for (uint16_t address = 0x3F00; address < 0x3F20; ++address) {
        const uint8_t palette_index = nes_->ppu().read_byte(address);
        ImGui::PushID(palette_index);
        if ((address % 4) == 0) {
            ImGui::Text("%s", palette_text[text_index++].c_str());
            ImGui::SameLine(100);
        }
        if ((address % 4) != 0) {
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemSpacing.y);
        }
        const ImVec4 color = ppu_helper_->get_color_from_index(palette_index);
        ImGui::ColorButton("##backgroundpalette",
                color,
                ImGuiColorEditFlags_NoPicker | ImGuiColorEditFlags_NoTooltip,
                ImVec2(20, 20));
        if (ImGui::IsItemHovered()) {
            ImGui::BeginTooltip();
            ImGui::Text("Address: %04hX", address);
            ImGui::Text("index: %02hhX", palette_index);
            ImGui::EndTooltip();
        }

        ImGui::PopID();
    }
    ImGui::PopID(); // background palette

    ImGui::PushID("palette");
    for (int n = 0; n < ppu_helper_->kPaletteSize; n++) {
        ImGui::PushID(n);
        if ((n % 16) != 0) {
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemSpacing.y);
        }
        const ImVec4 color = ppu_helper_->get_color_from_index(n);
        ImGui::ColorButton("##palette",
                color,
                ImGuiColorEditFlags_NoPicker,
                ImVec2(20, 20));

        ImGui::PopID();
    }
    ImGui::PopID(); // palette
}